

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DisableStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DisableStatement,slang::ast::Symbol_const&,bool&,slang::SourceRange>
          (BumpAllocator *this,Symbol *args,bool *args_1,SourceRange *args_2)

{
  bool bVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  DisableStatement *pDVar4;
  
  pDVar4 = (DisableStatement *)allocate(this,0x30,8);
  bVar1 = *args_1;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  (pDVar4->super_Statement).kind = Disable;
  (pDVar4->super_Statement).syntax = (StatementSyntax *)0x0;
  (pDVar4->super_Statement).sourceRange.startLoc = SVar2;
  (pDVar4->super_Statement).sourceRange.endLoc = SVar3;
  pDVar4->target = args;
  pDVar4->isHierarchical = bVar1;
  return pDVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }